

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22ecb::RcInterfaceTest::RunSvcDynamicSpatial(RcInterfaceTest *this)

{
  bool bVar1;
  RcInterfaceTest *in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff04;
  unique_ptr<aom::AV1RateControlRTC,_std::default_delete<aom::AV1RateControlRTC>_> *this_00;
  int line;
  allocator *file;
  undefined4 in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  allocator local_91;
  string local_90 [8];
  AV1RateControlRtcConfig *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  undefined1 local_70 [96];
  unique_ptr<aom::AV1RateControlRTC,_std::default_delete<aom::AV1RateControlRTC>_> local_10 [2];
  
  in_RDI->dynamic_spatial_layers_ = true;
  in_RDI->key_interval_ = 10000;
  SetConfigSvc(in_RDI,3,3);
  this_00 = local_10;
  aom::AV1RateControlRTC::Create(in_stack_ffffffffffffff78);
  std::unique_ptr<aom::AV1RateControlRTC,_std::default_delete<aom::AV1RateControlRTC>_>::operator=
            ((unique_ptr<aom::AV1RateControlRTC,_std::default_delete<aom::AV1RateControlRTC>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (unique_ptr<aom::AV1RateControlRTC,_std::default_delete<aom::AV1RateControlRTC>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::unique_ptr<aom::AV1RateControlRTC,_std::default_delete<aom::AV1RateControlRTC>_>::~unique_ptr
            (this_00);
  (in_RDI->frame_params_).spatial_layer_id = 0;
  (in_RDI->frame_params_).temporal_layer_id = 0;
  file = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"niklas_640_480_30.yuv",file);
  uVar2 = 0x1c2;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_ffffffffffffff30,
             (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (uint)((ulong)file >> 0x20),(uint)file,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffff30)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(in_RDI,local_70);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff40);
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_ffffffffffffff04,uVar2));
    if ((!bVar1) || (!bVar1)) goto LAB_0013739e;
  }
  line = (int)((ulong)in_RDI >> 0x20);
  testing::Message::Message((Message *)in_stack_ffffffffffffff30);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,(char *)file,line,
             (char *)this_00);
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,uVar2));
  testing::Message::~Message((Message *)0x137358);
LAB_0013739e:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x1373ab);
  return;
}

Assistant:

void RunSvcDynamicSpatial() {
    dynamic_spatial_layers_ = true;
    key_interval_ = 10000;
    SetConfigSvc(3, 3);
    rc_api_ = aom::AV1RateControlRTC::Create(rc_cfg_);
    frame_params_.spatial_layer_id = 0;
    frame_params_.temporal_layer_id = 0;

    ::libaom_test::I420VideoSource video("niklas_640_480_30.yuv", 640, 480, 30,
                                         1, 0, kNumFrames);

    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }